

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::symbols
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UErrorCode *this;
  bool bVar1;
  int iVar2;
  char *__s1;
  ConstChar16Ptr local_50 [3];
  ConstChar16Ptr local_38;
  NumberingSystem *local_30;
  NumberingSystem *ns;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  ns = (NumberingSystem *)status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  bVar1 = SymbolsWrapper::isNumberingSystem(&macros->symbols);
  if (bVar1) {
    local_30 = SymbolsWrapper::getNumberingSystem
                         ((SymbolsWrapper *)&sb_local[2].fUnion.fStackFields);
    __s1 = NumberingSystem::getName(local_30);
    iVar2 = strcmp(__s1,"latn");
    this = status_local;
    if (iVar2 == 0) {
      ConstChar16Ptr::ConstChar16Ptr(&local_38,L"latin");
      icu_63::UnicodeString::append((UnicodeString *)this,&local_38,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(local_50,L"numbering-system/");
      icu_63::UnicodeString::append((UnicodeString *)this,local_50,-1);
      ConstChar16Ptr::~ConstChar16Ptr(local_50);
      blueprint_helpers::generateNumberingSystemOption
                (local_30,(UnicodeString *)status_local,(UErrorCode *)ns);
    }
    macros_local._7_1_ = true;
  }
  else {
    bVar1 = SymbolsWrapper::isDecimalFormatSymbols
                      ((SymbolsWrapper *)&sb_local[2].fUnion.fStackFields);
    if (bVar1) {
      *(undefined4 *)&(ns->super_UObject)._vptr_UObject = 0x10;
      macros_local._7_1_ = false;
    }
    else {
      macros_local._7_1_ = false;
    }
  }
  return macros_local._7_1_;
}

Assistant:

bool GeneratorHelpers::symbols(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.symbols.isNumberingSystem()) {
        const NumberingSystem& ns = *macros.symbols.getNumberingSystem();
        if (uprv_strcmp(ns.getName(), "latn") == 0) {
            sb.append(u"latin", -1);
        } else {
            sb.append(u"numbering-system/", -1);
            blueprint_helpers::generateNumberingSystemOption(ns, sb, status);
        }
        return true;
    } else if (macros.symbols.isDecimalFormatSymbols()) {
        status = U_UNSUPPORTED_ERROR;
        return false;
    } else {
        // No custom symbols
        return false;
    }
}